

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ReadLine
               (ImGuiContext_conflict *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  float *pfVar1;
  int iVar2;
  char *pcVar3;
  int r;
  char c;
  int n;
  int column_n;
  float f;
  int local_34;
  char local_2d;
  float local_2c;
  int local_28;
  float local_24;
  
  local_24 = 0.0;
  local_28 = 0;
  local_34 = 0;
  local_2c = 0.0;
  iVar2 = __isoc99_sscanf(line,"RefScale=%f");
  if (iVar2 == 1) {
    *(float *)((long)entry + 8) = local_24;
  }
  else {
    iVar2 = __isoc99_sscanf(line,"Column %d%n",&local_28,&local_34);
    if (((iVar2 == 1) && (-1 < local_28)) && (local_28 < *(char *)((long)entry + 0xc))) {
      pcVar3 = ImStrSkipBlank(line + local_34);
      local_2d = '\0';
      pfVar1 = (float *)((long)entry + (long)local_28 * 0xc + 0x10);
      *(char *)(pfVar1 + 2) = (char)local_28;
      iVar2 = __isoc99_sscanf(pcVar3,"UserID=0x%08X%n",&local_2c,&local_34);
      if (iVar2 == 1) {
        pcVar3 = ImStrSkipBlank(pcVar3 + local_34);
        pfVar1[1] = local_2c;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"Width=%d%n",&local_2c,&local_34);
      if (iVar2 == 1) {
        pcVar3 = ImStrSkipBlank(pcVar3 + local_34);
        *pfVar1 = (float)(int)local_2c;
        *(byte *)((long)pfVar1 + 0xb) = *(byte *)((long)pfVar1 + 0xb) & 0xf7;
        *(byte *)((long)entry + 4) = *(byte *)((long)entry + 4) | 1;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"Weight=%f%n",&local_24,&local_34);
      if (iVar2 == 1) {
        pcVar3 = ImStrSkipBlank(pcVar3 + local_34);
        *pfVar1 = local_24;
        *(byte *)((long)pfVar1 + 0xb) = *(byte *)((long)pfVar1 + 0xb) | 8;
        *(byte *)((long)entry + 4) = *(byte *)((long)entry + 4) | 1;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"Visible=%d%n",&local_2c,&local_34);
      if (iVar2 == 1) {
        pcVar3 = ImStrSkipBlank(pcVar3 + local_34);
        *(byte *)((long)pfVar1 + 0xb) =
             *(byte *)((long)pfVar1 + 0xb) & 0xfb | (local_2c._0_1_ & 1) << 2;
        *(byte *)((long)entry + 4) = *(byte *)((long)entry + 4) | 4;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"Order=%d%n",&local_2c,&local_34);
      if (iVar2 == 1) {
        pcVar3 = ImStrSkipBlank(pcVar3 + local_34);
        *(byte *)((long)pfVar1 + 9) = local_2c._0_1_;
        *(byte *)((long)entry + 4) = *(byte *)((long)entry + 4) | 2;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"Sort=%d%c%n",&local_2c,&local_2d,&local_34);
      if (iVar2 == 2) {
        ImStrSkipBlank(pcVar3 + local_34);
        *(byte *)((long)pfVar1 + 10) = local_2c._0_1_;
        *(byte *)((long)pfVar1 + 0xb) = (*(byte *)((long)pfVar1 + 0xb) & 0xfc | local_2d == '^') + 1
        ;
        *(byte *)((long)entry + 4) = *(byte *)((long)entry + 4) | 8;
      }
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
    ImGuiTableSettings* settings = (ImGuiTableSettings*)entry;
    float f = 0.0f;
    int column_n = 0, r = 0, n = 0;

    if (sscanf(line, "RefScale=%f", &f) == 1) { settings->RefScale = f; return; }

    if (sscanf(line, "Column %d%n", &column_n, &r) == 1)
    {
        if (column_n < 0 || column_n >= settings->ColumnsCount)
            return;
        line = ImStrSkipBlank(line + r);
        char c = 0;
        ImGuiTableColumnSettings* column = settings->GetColumnSettings() + column_n;
        column->Index = (ImGuiTableColumnIdx)column_n;
        if (sscanf(line, "UserID=0x%08X%n", (ImU32*)&n, &r)==1) { line = ImStrSkipBlank(line + r); column->UserID = (ImGuiID)n; }
        if (sscanf(line, "Width=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->WidthOrWeight = (float)n; column->IsStretch = 0; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Weight=%f%n", &f, &r) == 1)           { line = ImStrSkipBlank(line + r); column->WidthOrWeight = f; column->IsStretch = 1; settings->SaveFlags |= ImGuiTableFlags_Resizable; }
        if (sscanf(line, "Visible=%d%n", &n, &r) == 1)          { line = ImStrSkipBlank(line + r); column->IsEnabled = (ImU8)n; settings->SaveFlags |= ImGuiTableFlags_Hideable; }
        if (sscanf(line, "Order=%d%n", &n, &r) == 1)            { line = ImStrSkipBlank(line + r); column->DisplayOrder = (ImGuiTableColumnIdx)n; settings->SaveFlags |= ImGuiTableFlags_Reorderable; }
        if (sscanf(line, "Sort=%d%c%n", &n, &c, &r) == 2)       { line = ImStrSkipBlank(line + r); column->SortOrder = (ImGuiTableColumnIdx)n; column->SortDirection = (c == '^') ? ImGuiSortDirection_Descending : ImGuiSortDirection_Ascending; settings->SaveFlags |= ImGuiTableFlags_Sortable; }
    }
}